

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_status.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,mrg_status<int,_3,_trng::mrg3> *S)

{
  undefined4 uVar1;
  long lVar2;
  mrg_status<int,_3,_trng::mrg3> S_new;
  delim_c local_37;
  delim_c local_36;
  delim_c local_35;
  int local_34 [3];
  
  local_34[0] = 0;
  local_34[1] = 1;
  local_34[2] = 1;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_35.c = '(';
  utility::operator>>(in,&local_35);
  lVar2 = 0;
  do {
    std::istream::operator>>((istream *)in,(int *)((long)local_34 + lVar2));
    if (lVar2 != 8) {
      local_37.c = ' ';
      utility::operator>>(in,&local_37);
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  local_36.c = ')';
  utility::operator>>(in,&local_36);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    S->r[2] = local_34[2];
    *(ulong *)S->r = CONCAT44(local_34[1],local_34[0]);
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_status &S) {
      mrg_status S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> S_new.r[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        S = S_new;
      in.flags(flags);
      return in;
    }